

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void http_handle_file(nng_http *conn,void *arg,nni_aio *aio)

{
  int iVar1;
  nng_err result;
  nng_http_status local_4c;
  char *pcStack_48;
  nng_http_status status;
  char *ctype;
  http_file *hf;
  size_t sStack_30;
  int rv;
  size_t size;
  void *data;
  nni_aio *aio_local;
  void *arg_local;
  nng_http *conn_local;
  
  pcStack_48 = *(char **)((long)arg + 0x10);
  if (pcStack_48 == (char *)0x0) {
    pcStack_48 = "application/octet-stream";
  }
  data = aio;
  aio_local = (nni_aio *)arg;
  arg_local = conn;
  iVar1 = nni_file_get(*(char **)((long)arg + 8),(void **)&size,&stack0xffffffffffffffd0);
  if (iVar1 == 0) {
    hf._4_4_ = nni_http_set_header((nng_http *)arg_local,"Content-Type",pcStack_48);
    if ((hf._4_4_ == NNG_OK) &&
       (hf._4_4_ = nni_http_copy_body((nng_http *)arg_local,(void *)size,sStack_30),
       hf._4_4_ == NNG_OK)) {
      nng_http_set_status((nng_http *)arg_local,NNG_HTTP_STATUS_OK,(char *)0x0);
      nni_free((void *)size,sStack_30);
      nni_aio_finish((nni_aio *)data,NNG_OK,0);
      return;
    }
    nni_free((void *)size,sStack_30);
    nni_aio_finish_error((nni_aio *)data,hf._4_4_);
  }
  else {
    if (iVar1 == 2) {
      local_4c = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
    }
    else if (iVar1 == 0xc) {
      local_4c = NNG_HTTP_STATUS_NOT_FOUND;
    }
    else if (iVar1 == 0x10) {
      local_4c = NNG_HTTP_STATUS_FORBIDDEN;
    }
    else {
      local_4c = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
    }
    result = nni_http_set_error((nng_http *)arg_local,local_4c,(char *)0x0,(char *)0x0);
    if (result == NNG_OK) {
      nni_aio_finish((nni_aio *)data,NNG_OK,0);
    }
    else {
      nni_aio_finish_error((nni_aio *)data,result);
    }
  }
  return;
}

Assistant:

static void
http_handle_file(nng_http *conn, void *arg, nni_aio *aio)
{
	void       *data;
	size_t      size;
	int         rv;
	http_file  *hf = arg;
	const char *ctype;

	if ((ctype = hf->ctype) == NULL) {
		ctype = "application/octet-stream";
	}

	// This is a very simplistic file server, suitable only for small
	// files.  In the future we can use an AIO based file read, where
	// we read files a bit at a time, or even mmap them, and serve
	// them up chunkwise.  Applications could even come up with their own
	// caching version of the http handler.
	if ((rv = nni_file_get(hf->path, &data, &size)) != 0) {
		nng_http_status status;
		switch (rv) {
		case NNG_ENOMEM:
			status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
			break;
		case NNG_ENOENT:
			status = NNG_HTTP_STATUS_NOT_FOUND;
			break;
		case NNG_EPERM:
			status = NNG_HTTP_STATUS_FORBIDDEN;
			break;
		default:
			status = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
			break;
		}
		if ((rv = nni_http_set_error(conn, status, NULL, NULL)) != 0) {
			nni_aio_finish_error(aio, rv);
			return;
		}
		nni_aio_finish(aio, NNG_OK, 0);
		return;
	}
	if (((rv = nni_http_set_header(conn, "Content-Type", ctype)) != 0) ||
	    ((rv = nni_http_copy_body(conn, data, size)) != 0)) {
		nni_free(data, size);
		nni_aio_finish_error(aio, rv);
		return;
	}

	nng_http_set_status(conn, NNG_HTTP_STATUS_OK, NULL);

	nni_free(data, size);
	nni_aio_finish(aio, NNG_OK, 0);
}